

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

void nn_global_term(void)

{
  nn_transport *pnVar1;
  nn_transport **ppnVar2;
  
  if (self.socks == (nn_sock **)0x0) {
    nn_global_term_cold_1();
  }
  if (self.nsocks != 0) {
    return;
  }
  nn_pool_term(&self.pool);
  if (nn_transports[0] != (nn_transport *)0x0) {
    ppnVar2 = nn_transports;
    pnVar1 = nn_transports[0];
    do {
      ppnVar2 = ppnVar2 + 1;
      if (pnVar1->term != (_func_void *)0x0) {
        (*pnVar1->term)();
      }
      pnVar1 = *ppnVar2;
    } while (pnVar1 != (nn_transport *)0x0);
  }
  nn_free(self.socks);
  self.socks = (nn_sock **)0x0;
  nn_alloc_term();
  return;
}

Assistant:

static void nn_global_term (void)
{
#if defined NN_HAVE_WINDOWS
    int rc;
#endif
    const struct nn_transport *tp;
    int i;

    /*  If there are no sockets remaining, uninitialise the global context. */
    nn_assert (self.socks);
    if (self.nsocks > 0)
        return;

    /*  Shut down the worker threads. */
    nn_pool_term (&self.pool);

    /*  Ask all the transport to deallocate their global resources. */
    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->term)
            tp->term ();
    }

    /*  Final deallocation of the nn_global object itself. */
    nn_free (self.socks);

    /*  This marks the global state as uninitialised. */
    self.socks = NULL;

    /*  Shut down the memory allocation subsystem. */
    nn_alloc_term ();

    /*  On Windows, uninitialise the socket library. */
#if defined NN_HAVE_WINDOWS
    rc = WSACleanup ();
    nn_assert (rc == 0);
#endif
}